

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte *pbVar2;
  sqlite3 *psVar3;
  int iVar4;
  uchar *z;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  uchar *puVar8;
  int token;
  char *local_78;
  int local_6c;
  sqlite3 *local_68;
  uchar *local_60;
  sqlite3_context *local_58;
  void *local_50;
  byte *local_48;
  char *local_40;
  byte *local_38;
  
  local_68 = (context->s).db;
  local_58 = context;
  z = (uchar *)sqlite3ValueText(*argv,'\x01');
  pbVar5 = (byte *)sqlite3ValueText(argv[1],'\x01');
  local_50 = sqlite3ValueText(argv[2],'\x01');
  local_60 = z;
  if (*z == '\0') {
    local_78 = (char *)0x0;
  }
  else {
    local_48 = pbVar5 + 1;
    local_78 = (char *)0x0;
    local_38 = pbVar5;
    do {
      iVar4 = sqlite3GetToken(z,&local_6c);
      if (local_6c == 0x66) {
        do {
          puVar8 = z;
          z = puVar8 + iVar4;
          iVar4 = sqlite3GetToken(z,&local_6c);
        } while (local_6c == 0x95);
        if (puVar8 == (uchar *)0x0) {
          pbVar5 = (byte *)0x0;
        }
        else {
          pbVar5 = (byte *)sqlite3DbMallocRaw(local_68,iVar4 + 1);
          if (pbVar5 != (byte *)0x0) {
            memcpy(pbVar5,z,(long)iVar4);
            pbVar5[iVar4] = 0;
          }
        }
        if (pbVar5 != (byte *)0x0) {
          sqlite3Dequote((char *)pbVar5);
          psVar3 = local_68;
          bVar1 = *local_38;
          pbVar6 = pbVar5;
          pbVar2 = local_48;
          while ((bVar1 != 0 && (""[bVar1] == ""[*pbVar6]))) {
            pbVar6 = pbVar6 + 1;
            bVar1 = *pbVar2;
            pbVar2 = pbVar2 + 1;
          }
          if (""[bVar1] == ""[*pbVar6]) {
            pcVar7 = local_78;
            if (local_78 == (char *)0x0) {
              pcVar7 = "";
            }
            local_40 = sqlite3MPrintf(local_68,"%s%.*s\"%w\"",pcVar7,(long)z - (long)local_60,
                                      local_60,local_50);
            sqlite3DbFree(psVar3,local_78);
            local_60 = z + iVar4;
            local_78 = local_40;
          }
          sqlite3DbFree(psVar3,pbVar5);
        }
        if (pbVar5 == (byte *)0x0) break;
      }
      puVar8 = z + iVar4;
      z = z + iVar4;
    } while (*puVar8 != '\0');
  }
  psVar3 = local_68;
  pcVar7 = "";
  if (local_78 != (char *)0x0) {
    pcVar7 = local_78;
  }
  pcVar7 = sqlite3MPrintf(local_68,"%s%s",pcVar7,local_60);
  setResultStrOrError(local_58,pcVar7,-1,'\x01',sqlite3MallocSize);
  sqlite3DbFree(psVar3,local_78);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), z-zInput, zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}